

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::MessageFieldGenerator::GenerateSerializationCode
          (MessageFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,
                     "if ($has_property_check$) {\n  output.WriteRawTag($tag_bytes$);\n  output.WriteMessage($property_name$);\n}\n"
                    );
  return;
}

Assistant:

void MessageFieldGenerator::GenerateSerializationCode(io::Printer* printer) {
  printer->Print(
    variables_,
    "if ($has_property_check$) {\n"
    "  output.WriteRawTag($tag_bytes$);\n"
    "  output.WriteMessage($property_name$);\n"
    "}\n");
}